

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

Abc_Ntk_t * Io_Read(char *pFileName,Io_FileType_t FileType,int fCheck,int fBarBufs)

{
  int iVar1;
  uint uVar2;
  Io_FileType_t IVar3;
  Vec_Ptr_t *tempLtlStore;
  Abc_Ntk_t *pAVar4;
  Vec_Ptr_t *vLtl;
  Abc_Ntk_t *pTemp;
  Abc_Ntk_t *pNtk;
  int fBarBufs_local;
  int fCheck_local;
  Io_FileType_t FileType_local;
  char *pFileName_local;
  
  pFileName_local = (char *)Io_ReadNetlist(pFileName,FileType,fCheck);
  if ((Abc_Ntk_t *)pFileName_local == (Abc_Ntk_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    tempLtlStore = temporaryLtlStore((Abc_Ntk_t *)pFileName_local);
    iVar1 = Abc_NtkIsNetlist((Abc_Ntk_t *)pFileName_local);
    if (iVar1 != 0) {
      if (fBarBufs == 0) {
        iVar1 = Abc_NtkIsNetlist((Abc_Ntk_t *)pFileName_local);
        if (iVar1 == 0) {
          __assert_fail("Abc_NtkIsNetlist(pNtk)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioUtil.c"
                        ,0x102,"Abc_Ntk_t *Io_Read(char *, Io_FileType_t, int, int)");
        }
        iVar1 = Abc_NtkWhiteboxNum((Abc_Ntk_t *)pFileName_local);
        pTemp = (Abc_Ntk_t *)pFileName_local;
        if (0 < iVar1) {
          pTemp = Abc_NtkFlattenLogicHierarchy((Abc_Ntk_t *)pFileName_local);
          Abc_NtkDelete((Abc_Ntk_t *)pFileName_local);
          if (pTemp == (Abc_Ntk_t *)0x0) {
            fprintf(_stdout,"Flattening logic hierarchy has failed.\n");
            return (Abc_Ntk_t *)0x0;
          }
        }
        iVar1 = Abc_NtkBlackboxNum(pTemp);
        if (0 < iVar1) {
          uVar2 = Abc_NtkBlackboxNum(pTemp);
          printf("Hierarchy reader converted %d instances of blackboxes.\n",(ulong)uVar2);
          pAVar4 = Abc_NtkConvertBlackboxes(pTemp);
          Abc_NtkDelete(pTemp);
          pTemp = pAVar4;
          if (pAVar4 == (Abc_Ntk_t *)0x0) {
            fprintf(_stdout,"Converting blackboxes has failed.\n");
            return (Abc_Ntk_t *)0x0;
          }
        }
        IVar3 = Io_ReadFileType(pFileName);
        if (IVar3 == IO_FILE_BLIFMV) {
          pFileName_local = (char *)Abc_NtkStrashBlifMv(pTemp);
          Abc_NtkDelete(pTemp);
          if ((Abc_Ntk_t *)pFileName_local == (Abc_Ntk_t *)0x0) {
            fprintf(_stdout,"Converting BLIF-MV to AIG has failed.\n");
            pFileName_local = (char *)0x0;
          }
        }
        else {
          pFileName_local = (char *)Abc_NtkToLogic(pTemp);
          if (tempLtlStore != (Vec_Ptr_t *)0x0) {
            updateLtlStoreOfNtk((Abc_Ntk_t *)pFileName_local,tempLtlStore);
          }
          Abc_NtkDelete(pTemp);
          if ((Abc_Ntk_t *)pFileName_local == (Abc_Ntk_t *)0x0) {
            fprintf(_stdout,"Converting netlist to logic network after reading has failed.\n");
            pFileName_local = (char *)0x0;
          }
        }
      }
      else {
        pAVar4 = Abc_NtkToBarBufs((Abc_Ntk_t *)pFileName_local);
        Abc_NtkDelete((Abc_Ntk_t *)pFileName_local);
        iVar1 = Abc_NtkIsLogic(pAVar4);
        pFileName_local = (char *)pAVar4;
        if (iVar1 == 0) {
          __assert_fail("Abc_NtkIsLogic(pNtk)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioUtil.c"
                        ,0xfe,"Abc_Ntk_t *Io_Read(char *, Io_FileType_t, int, int)");
        }
      }
    }
  }
  return (Abc_Ntk_t *)pFileName_local;
}

Assistant:

Abc_Ntk_t * Io_Read( char * pFileName, Io_FileType_t FileType, int fCheck, int fBarBufs )
{
    Abc_Ntk_t * pNtk, * pTemp;
	Vec_Ptr_t * vLtl;
    // get the netlist
    pNtk = Io_ReadNetlist( pFileName, FileType, fCheck );
    if ( pNtk == NULL )
        return NULL;
	vLtl = temporaryLtlStore( pNtk );
    if ( !Abc_NtkIsNetlist(pNtk) )
        return pNtk;
    // derive barbufs
    if ( fBarBufs )
    {
        pNtk = Abc_NtkToBarBufs( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
        assert( Abc_NtkIsLogic(pNtk) );
        return pNtk;
    }
    // flatten logic hierarchy
    assert( Abc_NtkIsNetlist(pNtk) );
    if ( Abc_NtkWhiteboxNum(pNtk) > 0 )
    {
        pNtk = Abc_NtkFlattenLogicHierarchy( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
        if ( pNtk == NULL )
        {
            fprintf( stdout, "Flattening logic hierarchy has failed.\n" );
            return NULL;
        }
    }
    // convert blackboxes
    if ( Abc_NtkBlackboxNum(pNtk) > 0 )
    {
        printf( "Hierarchy reader converted %d instances of blackboxes.\n", Abc_NtkBlackboxNum(pNtk) );
        pNtk = Abc_NtkConvertBlackboxes( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
        if ( pNtk == NULL )
        {
            fprintf( stdout, "Converting blackboxes has failed.\n" );
            return NULL;
        }
    }
    // consider the case of BLIF-MV
    if ( Io_ReadFileType(pFileName) == IO_FILE_BLIFMV )
    {
        pNtk = Abc_NtkStrashBlifMv( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
        if ( pNtk == NULL )
        {
            fprintf( stdout, "Converting BLIF-MV to AIG has failed.\n" );
            return NULL;
        }
        return pNtk;
    }
    // convert the netlist into the logic network
    pNtk = Abc_NtkToLogic( pTemp = pNtk );
	if( vLtl )
		updateLtlStoreOfNtk( pNtk, vLtl );
    Abc_NtkDelete( pTemp );
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Converting netlist to logic network after reading has failed.\n" );
        return NULL;
    }
    return pNtk;
}